

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkleblock.cpp
# Opt level: O0

void __thiscall
CPartialMerkleTree::TraverseAndBuild
          (CPartialMerkleTree *this,int height,uint pos,
          vector<uint256,_std::allocator<uint256>_> *vTxid,
          vector<bool,_std::allocator<bool>_> *vMatch)

{
  long lVar1;
  const_reference cVar2;
  uint pos_00;
  uint height_00;
  uint uVar3;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  CPartialMerkleTree *in_R8;
  long in_FS_OFFSET;
  bool bVar4;
  uint p;
  bool fParentOfMatch;
  vector<uint256,_std::allocator<uint256>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  CPartialMerkleTree *in_stack_ffffffffffffff98;
  uint3 in_stack_ffffffffffffffb4;
  uint height_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  height_01 = (uint)in_stack_ffffffffffffffb4;
  pos_00 = in_EDX << ((byte)in_ESI & 0x1f);
  while( true ) {
    bVar4 = false;
    if (pos_00 < (uint)(in_EDX + 1 << ((byte)in_ESI & 0x1f))) {
      bVar4 = pos_00 < *(uint *)&(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    }
    if (!bVar4) break;
    cVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff98,
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    height_01 = CONCAT13((height_01 & 0x1000000) != 0 || cVar2,(int3)height_01);
    pos_00 = pos_00 + 1;
  }
  std::vector<bool,_std::allocator<bool>_>::push_back(in_RDI,false);
  if ((in_ESI == 0) || ((height_01 & 0x1000000) == 0)) {
    CalcHash(in_R8,height_01,pos_00,(vector<uint256,_std::allocator<uint256>_> *)in_RDI);
    std::vector<uint256,_std::allocator<uint256>_>::push_back
              (in_stack_ffffffffffffff88,(value_type *)0x197610e);
  }
  else {
    TraverseAndBuild((CPartialMerkleTree *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),
                     (uint)in_RCX,(vector<uint256,_std::allocator<uint256>_> *)in_R8,
                     (vector<bool,_std::allocator<bool>_> *)CONCAT44(height_01,pos_00));
    height_00 = in_EDX * 2 + 1;
    uVar3 = CalcTreeWidth(in_stack_ffffffffffffff98,height_00);
    if (height_00 < uVar3) {
      TraverseAndBuild((CPartialMerkleTree *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),
                       (uint)in_RCX,(vector<uint256,_std::allocator<uint256>_> *)in_R8,
                       (vector<bool,_std::allocator<bool>_> *)CONCAT44(height_01,pos_00));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CPartialMerkleTree::TraverseAndBuild(int height, unsigned int pos, const std::vector<uint256> &vTxid, const std::vector<bool> &vMatch) {
    // determine whether this node is the parent of at least one matched txid
    bool fParentOfMatch = false;
    for (unsigned int p = pos << height; p < (pos+1) << height && p < nTransactions; p++)
        fParentOfMatch |= vMatch[p];
    // store as flag bit
    vBits.push_back(fParentOfMatch);
    if (height==0 || !fParentOfMatch) {
        // if at height 0, or nothing interesting below, store hash and stop
        vHash.push_back(CalcHash(height, pos, vTxid));
    } else {
        // otherwise, don't store any hash, but descend into the subtrees
        TraverseAndBuild(height-1, pos*2, vTxid, vMatch);
        if (pos*2+1 < CalcTreeWidth(height-1))
            TraverseAndBuild(height-1, pos*2+1, vTxid, vMatch);
    }
}